

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

auto_ptr<cmFunctionBlocker> __thiscall
cmMakefile::RemoveFunctionBlocker(cmMakefile *this,cmFunctionBlocker *fb,cmListFileFunction *lff)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  reference ppcVar4;
  ostream *poVar5;
  cmCommandContext *in_RCX;
  auto_ptr<cmFunctionBlocker> local_278;
  cmFunctionBlocker *local_270;
  auto_ptr<cmFunctionBlocker> local_268;
  cmFunctionBlocker *local_260;
  cmFunctionBlocker **local_258;
  const_iterator local_250;
  cmFunctionBlocker *local_248;
  cmFunctionBlocker *b;
  undefined1 local_210 [8];
  ostringstream e;
  undefined1 local_98 [8];
  cmListFileContext closingContext;
  cmListFileContext *lfc;
  __normal_iterator<cmFunctionBlocker_**,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>
  local_40;
  iterator pos;
  size_type i;
  size_type barrier;
  cmListFileFunction *lff_local;
  cmFunctionBlocker *fb_local;
  cmMakefile *this_local;
  
  i = 0;
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &fb[8].StartingContext.FilePath._M_string_length);
  if (!bVar1) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &fb[8].StartingContext.FilePath._M_string_length);
    i = *pvVar3;
  }
  pos._M_current =
       (cmFunctionBlocker **)
       std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::size
                 ((vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_> *)
                  &fb[8].StartingContext.Name.field_2);
  while( true ) {
    if (pos._M_current <= i) {
      ::cm::auto_ptr<cmFunctionBlocker>::auto_ptr(&local_278,(cmFunctionBlocker *)0x0);
      local_270 = (cmFunctionBlocker *)
                  ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_278);
      ::cm::auto_ptr<cmFunctionBlocker>::auto_ptr
                ((auto_ptr<cmFunctionBlocker> *)this,(auto_ptr_ref<cmFunctionBlocker>)local_270);
      ::cm::auto_ptr<cmFunctionBlocker>::~auto_ptr(&local_278);
      return (auto_ptr<cmFunctionBlocker>)(cmFunctionBlocker *)this;
    }
    lfc = (cmListFileContext *)
          std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::begin
                    ((vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_> *)
                     &fb[8].StartingContext.Name.field_2);
    local_40 = __gnu_cxx::
               __normal_iterator<cmFunctionBlocker_**,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>
               ::operator+((__normal_iterator<cmFunctionBlocker_**,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>
                            *)&lfc,(long)pos._M_current + -1);
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmFunctionBlocker_**,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>
              ::operator*(&local_40);
    if (*ppcVar4 == (cmFunctionBlocker *)lff) break;
    pos._M_current = pos._M_current + -1;
  }
  ppcVar4 = __gnu_cxx::
            __normal_iterator<cmFunctionBlocker_**,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>
            ::operator*(&local_40);
  uVar2 = (*(*ppcVar4)->_vptr_cmFunctionBlocker[1])(*ppcVar4,in_RCX,fb);
  if ((uVar2 & 1) == 0) {
    closingContext.Line = (long)cmFunctionBlocker::GetStartingContext((cmFunctionBlocker *)lff);
    cmListFileContext::FromCommandContext
              ((cmListFileContext *)local_98,in_RCX,
               &((cmListFileContext *)closingContext.Line)->FilePath);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
    poVar5 = std::operator<<((ostream *)local_210,"A logical block opening on the line\n");
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = ::operator<<(poVar5,(cmListFileContext *)closingContext.Line);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"closes on the line\n");
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = ::operator<<(poVar5,(cmListFileContext *)local_98);
    poVar5 = std::operator<<(poVar5,"\n");
    std::operator<<(poVar5,"with mis-matching arguments.");
    std::__cxx11::ostringstream::str();
    IssueMessage((cmMakefile *)fb,AUTHOR_WARNING,(string *)&b);
    std::__cxx11::string::~string((string *)&b);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
    cmListFileContext::~cmListFileContext((cmListFileContext *)local_98);
  }
  ppcVar4 = __gnu_cxx::
            __normal_iterator<cmFunctionBlocker_**,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>
            ::operator*(&local_40);
  local_248 = *ppcVar4;
  __gnu_cxx::
  __normal_iterator<cmFunctionBlocker*const*,std::vector<cmFunctionBlocker*,std::allocator<cmFunctionBlocker*>>>
  ::__normal_iterator<cmFunctionBlocker**>
            ((__normal_iterator<cmFunctionBlocker*const*,std::vector<cmFunctionBlocker*,std::allocator<cmFunctionBlocker*>>>
              *)&local_250,&local_40);
  local_258 = (cmFunctionBlocker **)
              std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::erase
                        ((vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_> *)
                         &fb[8].StartingContext.Name.field_2,local_250);
  ::cm::auto_ptr<cmFunctionBlocker>::auto_ptr(&local_268,local_248);
  local_260 = (cmFunctionBlocker *)
              ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_268);
  ::cm::auto_ptr<cmFunctionBlocker>::auto_ptr
            ((auto_ptr<cmFunctionBlocker> *)this,(auto_ptr_ref<cmFunctionBlocker>)local_260);
  ::cm::auto_ptr<cmFunctionBlocker>::~auto_ptr(&local_268);
  return (auto_ptr<cmFunctionBlocker>)(cmFunctionBlocker *)this;
}

Assistant:

CM_AUTO_PTR<cmFunctionBlocker> cmMakefile::RemoveFunctionBlocker(
  cmFunctionBlocker* fb, const cmListFileFunction& lff)
{
  // Find the function blocker stack barrier for the current scope.
  // We only remove a blocker whose index is not less than the barrier.
  FunctionBlockersType::size_type barrier = 0;
  if (!this->FunctionBlockerBarriers.empty()) {
    barrier = this->FunctionBlockerBarriers.back();
  }

  // Search for the function blocker whose scope this command ends.
  for (FunctionBlockersType::size_type i = this->FunctionBlockers.size();
       i > barrier; --i) {
    std::vector<cmFunctionBlocker*>::iterator pos =
      this->FunctionBlockers.begin() + (i - 1);
    if (*pos == fb) {
      // Warn if the arguments do not match, but always remove.
      if (!(*pos)->ShouldRemove(lff, *this)) {
        cmListFileContext const& lfc = fb->GetStartingContext();
        cmListFileContext closingContext =
          cmListFileContext::FromCommandContext(lff, lfc.FilePath);
        std::ostringstream e;
        /* clang-format off */
        e << "A logical block opening on the line\n"
          << "  " << lfc << "\n"
          << "closes on the line\n"
          << "  " << closingContext << "\n"
          << "with mis-matching arguments.";
        /* clang-format on */
        this->IssueMessage(cmake::AUTHOR_WARNING, e.str());
      }
      cmFunctionBlocker* b = *pos;
      this->FunctionBlockers.erase(pos);
      return CM_AUTO_PTR<cmFunctionBlocker>(b);
    }
  }

  return CM_AUTO_PTR<cmFunctionBlocker>();
}